

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,RepeatStatement *repeat_stmt,void *data)

{
  Instruction i;
  Instruction line;
  pointer pSVar1;
  Function *this_00;
  undefined8 in_RSI;
  CodeGenerateVisitor *in_RDI;
  int index;
  Instruction instruction;
  Function *function;
  ExpVarData_conflict exp_var_data;
  int register_id;
  Guard g_1;
  int r;
  Guard l;
  Guard g;
  undefined8 in_stack_fffffffffffffde8;
  OpType in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  anon_class_16_2_fd512ddf *in_stack_fffffffffffffdf8;
  JumpType in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  function<void_()> *in_stack_fffffffffffffe08;
  function<void_()> *enter;
  Guard *in_stack_fffffffffffffe10;
  CodeGenerateVisitor *this_01;
  CodeGenerateVisitor *this_02;
  ExpVarData local_19c;
  int local_188;
  CodeGenerateVisitor local_180;
  function<void_()> local_158 [2];
  int local_114;
  undefined8 local_e0;
  CodeGenerateVisitor local_d8 [8];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::RepeatStatement*,void*)::__0,void>
            ((function<void_()> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffdf8);
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::RepeatStatement*,void*)::__1,void>
            ((function<void_()> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffdf8);
  Guard::Guard(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (function<void_()> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  std::function<void_()>::~function((function<void_()> *)0x2078fb);
  std::function<void_()>::~function((function<void_()> *)0x207908);
  local_e0 = local_10;
  this_02 = local_d8;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::RepeatStatement*,void*)::__2,void>
            ((function<void_()> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             (anon_class_16_2_8d8e7219 *)in_stack_fffffffffffffdf8);
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::RepeatStatement*,void*)::__3,void>
            ((function<void_()> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffdf8);
  Guard::Guard(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (function<void_()> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  std::function<void_()>::~function((function<void_()> *)0x20798c);
  std::function<void_()>::~function((function<void_()> *)0x207999);
  local_114 = GetNextRegisterId(in_RDI);
  enter = local_158;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::RepeatStatement*,void*)::__4,void>
            ((function<void_()> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             (anon_class_1_0_00000001 *)in_stack_fffffffffffffdf8);
  local_188 = local_114;
  this_01 = &local_180;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::RepeatStatement*,void*)::__5,void>
            ((function<void_()> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             in_stack_fffffffffffffdf8);
  Guard::Guard((Guard *)this_01,enter,
               (function<void_()> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  std::function<void_()>::~function((function<void_()> *)0x207a29);
  std::function<void_()>::~function((function<void_()> *)0x207a36);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x207a47);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,0);
  Guard::~Guard((Guard *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  i.opcode_ = GenerateRegisterId(this_02);
  local_19c._8_4_ = i.opcode_;
  ExpVarData::ExpVarData(&local_19c,i.opcode_,i.opcode_ + 1);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x207aae);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,&local_19c);
  this_00 = GetCurrentFunction(in_RDI);
  line = Instruction::AsBxCode
                   (in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                    (int)in_stack_fffffffffffffde8);
  Function::AddInstruction(this_00,i,line.opcode_);
  AddLoopJumpInfo(this_01,(SyntaxTree *)enter,i.opcode_,in_stack_fffffffffffffe00);
  Guard::~Guard((Guard *)CONCAT44(line.opcode_,in_stack_fffffffffffffdf0));
  Guard::~Guard((Guard *)CONCAT44(line.opcode_,in_stack_fffffffffffffdf0));
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(RepeatStatement *repeat_stmt, void *data)
    {
        CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);
        LOOP_GUARD(repeat_stmt);
        {
            REGISTER_GENERATOR_GUARD();
            repeat_stmt->block_->Accept(this, nullptr);
        }

        // Get exp value
        auto register_id = GenerateRegisterId();
        ExpVarData exp_var_data{ register_id, register_id + 1 };
        repeat_stmt->exp_->Accept(this, &exp_var_data);

        // Jump to head when exp value is true
        auto function = GetCurrentFunction();
        auto instruction = Instruction::AsBxCode(OpType_JmpFalse, register_id, 0);
        int index = function->AddInstruction(instruction, repeat_stmt->line_);
        AddLoopJumpInfo(repeat_stmt, index, LoopJumpInfo::JumpHead);
    }